

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::TerminatedEvent>::construct
          (BasicTypeInfo<dap::TerminatedEvent> *this,void *ptr)

{
  vector<dap::any,_std::allocator<dap::any>_> local_28;
  
  *(undefined8 *)((long)ptr + 0x28) = 0;
  *(undefined8 *)((long)ptr + 0x30) = 0;
  *(undefined8 *)((long)ptr + 0x18) = 0;
  *(undefined8 *)((long)ptr + 0x20) = 0;
  *(undefined8 *)((long)ptr + 0x38) = 0;
  local_28.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)ptr = 0;
  *(undefined8 *)((long)ptr + 8) = 0;
  any::operator=((any *)ptr,&local_28);
  std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_28);
  *(undefined1 *)((long)ptr + 0x38) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }